

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::LoadConstantNDLayerParams::InternalSwap
          (LoadConstantNDLayerParams *this,LoadConstantNDLayerParams *other)

{
  LoadConstantNDLayerParams *other_local;
  LoadConstantNDLayerParams *this_local;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap(&this->shape_,&other->shape_);
  std::swap<CoreML::Specification::WeightParams*>(&this->data_,&other->data_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void LoadConstantNDLayerParams::InternalSwap(LoadConstantNDLayerParams* other) {
  shape_.InternalSwap(&other->shape_);
  std::swap(data_, other->data_);
  std::swap(_cached_size_, other->_cached_size_);
}